

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV2CameraSettingsBlock(Parser *this,Camera *camera)

{
  bool bVar1;
  byte *pbVar2;
  byte bVar3;
  ai_real *fOut;
  int local_3c;
  
  local_3c = 0;
LAB_003e11f2:
  do {
    pbVar2 = (byte *)this->filePtr;
    bVar3 = *pbVar2;
    if (bVar3 == 0x2a) {
      this->filePtr = (char *)(pbVar2 + 1);
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CAMERA_NEAR",0xb);
      fOut = &camera->mNear;
      if (((bVar1) ||
          (bVar1 = TokenMatch<char_const>(&this->filePtr,"CAMERA_FAR",10), fOut = &camera->mFar,
          bVar1)) ||
         (bVar1 = TokenMatch<char_const>(&this->filePtr,"CAMERA_FOV",10),
         fOut = (ai_real *)&(camera->super_BaseNode).field_0x154, bVar1)) {
        ParseLV4MeshFloat(this,fOut);
        goto LAB_003e11f2;
      }
      pbVar2 = (byte *)this->filePtr;
      bVar3 = *pbVar2;
    }
    if ((bVar3 - 0xc < 2) || (bVar3 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003e129e;
      this->iLineNumber = this->iLineNumber + 1;
      bVar1 = true;
    }
    else {
      if (bVar3 == 0x7b) {
        local_3c = local_3c + 1;
      }
      else if (bVar3 == 0x7d) {
        local_3c = local_3c + -1;
        if (local_3c == 0) {
          this->filePtr = (char *)(pbVar2 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (bVar3 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a CAMERA_SETTINGS chunk (Level 2)");
      }
LAB_003e129e:
      bVar1 = false;
    }
    this->bLastWasEndLine = bVar1;
    this->filePtr = (char *)(pbVar2 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV2CameraSettingsBlock(ASE::Camera& camera)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"CAMERA_NEAR" ,11))
            {
                ParseLV4MeshFloat(camera.mNear);
                continue;
            }
            if (TokenMatch(filePtr,"CAMERA_FAR" ,10))
            {
                ParseLV4MeshFloat(camera.mFar);
                continue;
            }
            if (TokenMatch(filePtr,"CAMERA_FOV" ,10))
            {
                ParseLV4MeshFloat(camera.mFOV);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","CAMERA_SETTINGS");
    }
    return;
}